

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::error_code> *
testing::internal::ActionResultHolder<std::error_code>::PerformAction<std::error_code(double)>
          (Action<std::error_code_(double)> *action,ArgumentTuple *args)

{
  ArgumentTuple *this;
  ActionResultHolder<std::error_code> *this_00;
  Result RVar1;
  error_code value;
  Wrapper result;
  tuple<double> local_40;
  uint local_38;
  error_category *local_30;
  ReferenceOrValueWrapper<std::error_code> local_28;
  tuple<double> *local_18;
  ArgumentTuple *args_local;
  Action<std::error_code_(double)> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<std::error_code> *)operator_new(0x18);
  this = args_local;
  std::tuple<double>::tuple(&local_40,local_18);
  RVar1 = Action<std::error_code_(double)>::Perform
                    ((Action<std::error_code_(double)> *)this,&local_40);
  value._M_cat = RVar1._M_cat;
  local_38 = RVar1._M_value;
  value._4_4_ = 0;
  value._M_value = local_38;
  local_30 = value._M_cat;
  ReferenceOrValueWrapper<std::error_code>::ReferenceOrValueWrapper(&local_28,value);
  result.value_._4_4_ = 0;
  result.value_._M_value = local_28.value_._M_value;
  result.value_._M_cat = local_28.value_._M_cat;
  ActionResultHolder(this_00,result);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }